

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                *this)

{
  size_t capacity;
  size_t sVar1;
  long lVar2;
  Layout LVar3;
  
  if (this->capacity_ != 0) {
    capacity = this->capacity_;
    if (capacity != 0) {
      lVar2 = 0;
      sVar1 = 0;
      do {
        if (-1 < this->ctrl_[sVar1]) {
          __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,cs::callable>>::
          destroy<std::pair<std::__cxx11::string_const,cs::callable>>
                    ((new_allocator<std::pair<std::__cxx11::string_const,cs::callable>> *)
                     &this->settings_,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>
                      *)((long)this->slots_ + lVar2));
        }
        sVar1 = sVar1 + 1;
        capacity = this->capacity_;
        lVar2 = lVar2 + 0x48;
      } while (sVar1 != capacity);
    }
    LVar3 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
              ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>
                *)&this->settings_,this->ctrl_,
               (LVar3.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_cs::callable>_>
                .size_[0] + 7 & 0xfffffffffffffff8) +
               LVar3.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_cs::callable>_>
               .size_[1] * 0x48);
    this->ctrl_ = EmptyGroup()::empty_group;
    (this->settings_).
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = 0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

void destroy_slots()
			{
				if (!capacity_) return;
				for (size_t i = 0; i != capacity_; ++i) {
					if (IsFull(ctrl_[i])) {
						PolicyTraits::destroy(&alloc_ref(), slots_ + i);
					}
				}
				auto layout = MakeLayout(capacity_);
				// Unpoison before returning the memory to the allocator.
				SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
				Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
				ctrl_ = EmptyGroup();
				slots_ = nullptr;
				size_ = 0;
				capacity_ = 0;
				growth_left() = 0;
			}